

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.h
# Opt level: O2

int __thiscall GF2::BFunc<9UL>::Deg(BFunc<9UL> *this)

{
  int iVar1;
  MP<9UL,_GF2::MOLex<9UL>_> poly;
  MP<9UL,_GF2::MOLex<9UL>_> local_28;
  
  local_28.super_list<GF2::MM<9UL>,_std::allocator<GF2::MM<9UL>_>_>.
  super__List_base<GF2::MM<9UL>,_std::allocator<GF2::MM<9UL>_>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&local_28;
  local_28.super_list<GF2::MM<9UL>,_std::allocator<GF2::MM<9UL>_>_>.
  super__List_base<GF2::MM<9UL>,_std::allocator<GF2::MM<9UL>_>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&local_28;
  local_28.super_list<GF2::MM<9UL>,_std::allocator<GF2::MM<9UL>_>_>.
  super__List_base<GF2::MM<9UL>,_std::allocator<GF2::MM<9UL>_>_>._M_impl._M_node._M_size = 0;
  BFunc<9ul>::To<GF2::MOLex<9ul>>((BFunc<9ul> *)this,&local_28);
  iVar1 = MP<9UL,_GF2::MOLex<9UL>_>::Deg(&local_28);
  std::__cxx11::_List_base<GF2::MM<9UL>,_std::allocator<GF2::MM<9UL>_>_>::_M_clear
            ((_List_base<GF2::MM<9UL>,_std::allocator<GF2::MM<9UL>_>_> *)&local_28);
  return iVar1;
}

Assistant:

int Deg() const
	{	
		MP<_n> poly;
		To(poly);
		return poly.Deg();
	}